

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall kratos::IRVisitor::visit_root_tp(IRVisitor *this,IRNode *root)

{
  pointer *this_00;
  bool bVar1;
  IRNodeKind IVar2;
  uint32_t uVar3;
  size_type __n;
  reference ppGVar4;
  reference this_01;
  future<void> *t_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range1_1;
  undefined1 local_1a8 [8];
  future<void> t;
  Generator *mod;
  iterator __end1;
  iterator __begin1;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__range1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  thread_pool pool;
  uint32_t num_cpus;
  undefined1 local_78 [8];
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> nodes;
  GeneratorGraph graph;
  Generator *gen;
  IRNode *root_local;
  IRVisitor *this_local;
  
  IVar2 = IRNode::ir_node_kind(root);
  if (IVar2 == GeneratorKind) {
    this_00 = &nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    GeneratorGraph::GeneratorGraph((GeneratorGraph *)this_00,(Generator *)root);
    GeneratorGraph::get_nodes
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78,
               (GeneratorGraph *)this_00);
    uVar3 = get_num_cpus();
    cxxpool::thread_pool::thread_pool
              ((thread_pool *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range1);
    __n = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                    ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range1,__n);
    __end1 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                       ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                        local_78);
    mod = (Generator *)
          std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                    ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                                  *)&mod);
      if (!bVar1) break;
      ppGVar4 = __gnu_cxx::
                __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                ::operator*(&__end1);
      t.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppGVar4;
      __range1_1 = (vector<std::future<void>,_std::allocator<std::future<void>_>_> *)this;
      cxxpool::thread_pool::
      push<kratos::IRVisitor::visit_root_tp(kratos::IRNode*)::__0,kratos::Generator*&>
                ((thread_pool *)local_1a8,
                 (anon_class_8_1_8991fb9c_for__M_f *)
                 &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(Generator **)&__range1_1);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&__range1,
                 (future<void> *)local_1a8);
      std::future<void>::~future((future<void> *)local_1a8);
      __gnu_cxx::
      __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
      ::operator++(&__end1);
    }
    __end1_1 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                         ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                          &__range1);
    t_1 = (future<void> *)
          std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                    ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          *)&t_1);
      if (!bVar1) break;
      this_01 = __gnu_cxx::
                __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                ::operator*(&__end1_1);
      std::future<void>::get(this_01);
      __gnu_cxx::
      __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
      ::operator++(&__end1_1);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range1);
    cxxpool::thread_pool::~thread_pool
              ((thread_pool *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78);
    GeneratorGraph::~GeneratorGraph
              ((GeneratorGraph *)
               &nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    (**this->_vptr_IRVisitor)(this,root);
  }
  return;
}

Assistant:

void IRVisitor::visit_root_tp(kratos::IRNode *root) {
    if (root->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // nothing we can do
        visit_root(root);
        return;
    }
    auto *gen = reinterpret_cast<Generator *>(root);
    GeneratorGraph graph(gen);

    auto nodes = graph.get_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<void>> tasks;
    tasks.reserve(nodes.size());

    for (auto *mod : nodes) {
        auto t = pool.push(
            [this](Generator *g) {
                if (g->external() || g->is_cloned()) return;
                g->accept(this);
                uint64_t count = 0;
                while (count < g->child_count()) {
                    auto *child = g->get_child(count);
                    if (child->ir_node_kind() != IRNodeKind::GeneratorKind) {
                        visit_root_s(child);
                    }
                    if (count < g->child_count() && child == g->get_child(count)) {
                        count++;
                    }
                }
            },
            mod);
        tasks.emplace_back(std::move(t));
    }

    for (auto &t : tasks) {
        t.get();
    }
}